

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O1

CURLcode glob_next_url(char **globbed,URLGlob *glob)

{
  size_t sVar1;
  CURLcode CVar2;
  size_t sVar3;
  size_t sVar4;
  curl_off_t *pcVar5;
  ulong uVar6;
  char cVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  bool bVar11;
  
  sVar1 = glob->urllen;
  pcVar9 = glob->glob_buffer;
  *globbed = (char *)0x0;
  if (glob->beenhere == '\0') {
    glob->beenhere = '\x01';
  }
  else {
    sVar3 = glob->size;
    if (sVar3 == 0) {
      CVar2 = CURLE_OK;
      bVar11 = false;
    }
    else {
      pcVar5 = &glob->pattern[sVar3 - 1].content.NumRange.step;
      do {
        sVar3 = sVar3 - 1;
        iVar8 = (int)pcVar5[-5];
        if (iVar8 == 3) {
          lVar10 = pcVar5[-1];
          pcVar5[-1] = lVar10 + *pcVar5;
          if (lVar10 + *pcVar5 <= pcVar5[-3]) goto LAB_0011e7e0;
          pcVar5[-1] = ((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar5 + -4))->min_n;
LAB_0011e7dc:
          bVar11 = true;
        }
        else if (iVar8 == 2) {
          cVar7 = *(char *)((long)pcVar5 + -0x1e) + *(char *)((long)pcVar5 + -0x1c);
          *(char *)((long)pcVar5 + -0x1e) = cVar7;
          if (*(char *)((long)pcVar5 + -0x1f) < cVar7) {
            *(char *)((long)pcVar5 + -0x1e) =
                 (char)((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar5 + -4))->min_n;
            goto LAB_0011e7dc;
          }
LAB_0011e7e0:
          bVar11 = false;
        }
        else {
          if (iVar8 != 1) {
            bVar11 = false;
            curl_mprintf("internal error: invalid pattern type (%d)\n");
            CVar2 = CURLE_FAILED_INIT;
            goto LAB_0011e81c;
          }
          if (((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar5 + -4))->min_n == 0)
          goto LAB_0011e7e0;
          bVar11 = pcVar5[-3] == (long)*(int *)(pcVar5 + -2) + 1;
          iVar8 = (int)((long)*(int *)(pcVar5 + -2) + 1);
          if (bVar11) {
            iVar8 = 0;
          }
          *(int *)(pcVar5 + -2) = iVar8;
        }
      } while ((sVar3 != 0) && (pcVar5 = pcVar5 + -6, bVar11));
      bVar11 = (bool)(bVar11 ^ 1);
      CVar2 = CURLE_OK;
    }
LAB_0011e81c:
    if (!bVar11) {
      return CVar2;
    }
  }
  if (glob->size != 0) {
    lVar10 = sVar1 + 1;
    pcVar5 = &glob->pattern[0].content.NumRange.ptr_n;
    uVar6 = 0;
    do {
      iVar8 = *(int *)(pcVar5 + -4);
      if (iVar8 == 3) {
        curl_msnprintf(pcVar9,lVar10,"%0*ld",*(int *)(pcVar5 + -1),*pcVar5);
LAB_0011e8af:
        sVar4 = strlen(pcVar9);
        pcVar9 = pcVar9 + sVar4;
        lVar10 = lVar10 - sVar4;
      }
      else if (iVar8 == 2) {
        if (lVar10 == 0) {
          lVar10 = 0;
        }
        else {
          *pcVar9 = *(char *)((long)pcVar5 + -0x16);
          pcVar9[1] = '\0';
          pcVar9 = pcVar9 + 1;
          lVar10 = lVar10 + -1;
        }
      }
      else {
        if (iVar8 != 1) {
          curl_mprintf("internal error: invalid pattern type (%d)\n");
          return CURLE_FAILED_INIT;
        }
        if (((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar5 + -3))->min_n != 0) {
          curl_msnprintf(pcVar9,lVar10,"%s",
                         *(undefined8 *)
                          (((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar5 + -3))->min_n +
                          (long)*(int *)(pcVar5 + -1) * 8));
          goto LAB_0011e8af;
        }
      }
      uVar6 = uVar6 + 1;
      pcVar5 = pcVar5 + 6;
    } while (uVar6 < glob->size);
  }
  pcVar9 = strdup(glob->glob_buffer);
  *globbed = pcVar9;
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (pcVar9 != (char *)0x0) {
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

CURLcode glob_next_url(char **globbed, struct URLGlob *glob)
{
  struct URLPattern *pat;
  size_t i;
  size_t len;
  size_t buflen = glob->urllen + 1;
  char *buf = glob->glob_buffer;

  *globbed = NULL;

  if(!glob->beenhere)
    glob->beenhere = 1;
  else {
    bool carry = TRUE;

    /* implement a counter over the index ranges of all patterns, starting
       with the rightmost pattern */
    for(i = 0; carry && (i < glob->size); i++) {
      carry = FALSE;
      pat = &glob->pattern[glob->size - 1 - i];
      switch(pat->type) {
      case UPTSet:
        if((pat->content.Set.elements) &&
           (++pat->content.Set.ptr_s == pat->content.Set.size)) {
          pat->content.Set.ptr_s = 0;
          carry = TRUE;
        }
        break;
      case UPTCharRange:
        pat->content.CharRange.ptr_c =
          (char)(pat->content.CharRange.step +
                 (int)((unsigned char)pat->content.CharRange.ptr_c));
        if(pat->content.CharRange.ptr_c > pat->content.CharRange.max_c) {
          pat->content.CharRange.ptr_c = pat->content.CharRange.min_c;
          carry = TRUE;
        }
        break;
      case UPTNumRange:
        pat->content.NumRange.ptr_n += pat->content.NumRange.step;
        if(pat->content.NumRange.ptr_n > pat->content.NumRange.max_n) {
          pat->content.NumRange.ptr_n = pat->content.NumRange.min_n;
          carry = TRUE;
        }
        break;
      default:
        printf("internal error: invalid pattern type (%d)\n", (int)pat->type);
        return CURLE_FAILED_INIT;
      }
    }
    if(carry) {         /* first pattern ptr has run into overflow, done! */
      return CURLE_OK;
    }
  }

  for(i = 0; i < glob->size; ++i) {
    pat = &glob->pattern[i];
    switch(pat->type) {
    case UPTSet:
      if(pat->content.Set.elements) {
        msnprintf(buf, buflen, "%s",
                  pat->content.Set.elements[pat->content.Set.ptr_s]);
        len = strlen(buf);
        buf += len;
        buflen -= len;
      }
      break;
    case UPTCharRange:
      if(buflen) {
        *buf++ = pat->content.CharRange.ptr_c;
        *buf = '\0';
        buflen--;
      }
      break;
    case UPTNumRange:
      msnprintf(buf, buflen, "%0*" CURL_FORMAT_CURL_OFF_T,
                pat->content.NumRange.padlength,
                pat->content.NumRange.ptr_n);
      len = strlen(buf);
      buf += len;
      buflen -= len;
      break;
    default:
      printf("internal error: invalid pattern type (%d)\n", (int)pat->type);
      return CURLE_FAILED_INIT;
    }
  }

  *globbed = strdup(glob->glob_buffer);
  if(!*globbed)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}